

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O0

int testStorageReaderTestsRawData(void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<MILBlob::Fp16> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  string *psVar2;
  size_t sVar3;
  ostream *poVar4;
  iterator ptVar5;
  iterator ptVar6;
  iterator ptVar7;
  iterator ptVar8;
  iterator __first2;
  iterator __last2;
  Span<const_unsigned_char,_18446744073709551615UL> SVar9;
  Span<unsigned_char,_18446744073709551615UL> SVar10;
  Span<MILBlob::Fp16,_18446744073709551615UL> SVar11;
  Span<unsigned_int,_18446744073709551615UL> SVar12;
  Span<MILBlob::Fp16,_18446744073709551615UL> span;
  Span<unsigned_int,_18446744073709551615UL> span_00;
  Span<unsigned_char,_18446744073709551615UL> local_1e0;
  Span<unsigned_int,_18446744073709551615UL> local_1d0;
  Span<unsigned_char,_18446744073709551615UL> local_1c0;
  allocator<unsigned_int> local_1a9;
  uint local_1a8 [4];
  iterator local_198;
  size_type local_190;
  undefined1 local_188 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> expectedValues_2;
  Span<const_unsigned_char,_18446744073709551615UL> data_2;
  Span<const_unsigned_char,_18446744073709551615UL> local_150;
  Span<MILBlob::Fp16,_18446744073709551615UL> local_140;
  Span<const_unsigned_char,_18446744073709551615UL> local_130;
  allocator<MILBlob::Fp16> local_119;
  Fp16 local_118;
  Fp16 local_116;
  Fp16 local_114;
  Fp16 local_112;
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> expectedValues_1;
  Span<const_unsigned_char,_18446744073709551615UL> data_1;
  Span<unsigned_char,_18446744073709551615UL> local_c8;
  allocator<unsigned_char> local_b6;
  uchar local_b5 [5];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expectedValues;
  undefined1 local_80 [8];
  Span<const_unsigned_char,_18446744073709551615UL> data;
  string local_60;
  StorageReader local_40;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&reader);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
  MILBlob::Blob::StorageReader::StorageReader(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_40,0x40);
  data.m_ptr = (pointer)SVar9.m_size.m_size;
  local_80 = (undefined1  [8])SVar9.m_ptr;
  sVar3 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                    ((Span<const_unsigned_char,_18446744073709551615UL> *)local_80);
  if (sVar3 == 5) {
    local_b5[0] = '\x02';
    local_b5[1] = 0;
    local_b5[2] = 0x40;
    local_b5[3] = 0;
    local_b5[4] = 7;
    local_b0 = local_b5;
    local_a8 = 5;
    std::allocator<unsigned_char>::allocator(&local_b6);
    __l_01._M_len = local_a8;
    __l_01._M_array = local_b0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,__l_01,&local_b6);
    std::allocator<unsigned_char>::~allocator(&local_b6);
    ptVar5 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)local_80);
    ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)local_80);
    local_c8 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    ptVar7 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin(&local_c8);
    SVar10 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    data_1.m_size.m_size = (size_t)SVar10.m_ptr;
    ptVar8 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                       ((Span<unsigned_char,_18446744073709551615UL> *)&data_1.m_size);
    bVar1 = std::equal<unsigned_char_const*,unsigned_char*>(ptVar5,ptVar6,ptVar7,ptVar8);
    expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if (expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x10b);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,
                               "std::equal(data.begin(), data.end(), Util::MakeSpan(expectedValues).begin(), Util::MakeSpan(expectedValues).end())"
                              );
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
    }
    expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    if (expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_40,0xc0);
      data_1.m_ptr = (pointer)SVar9.m_size.m_size;
      expectedValues_1.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)SVar9.m_ptr;
      sVar3 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                        ((Span<const_unsigned_char,_18446744073709551615UL> *)
                         &expectedValues_1.
                          super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar3 == 8) {
        MILBlob::Fp16::Fp16(&local_118,0xe);
        MILBlob::Fp16::Fp16(&local_116,0xc0fe);
        MILBlob::Fp16::Fp16(&local_114,0x810);
        MILBlob::Fp16::Fp16(&local_112,0);
        local_110 = &local_118;
        local_108 = 4;
        std::allocator<MILBlob::Fp16>::allocator(&local_119);
        __l_00._M_len = local_108;
        __l_00._M_array = local_110;
        std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
                  ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100,__l_00,
                   &local_119);
        std::allocator<MILBlob::Fp16>::~allocator(&local_119);
        ptVar5 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                           ((Span<const_unsigned_char,_18446744073709551615UL> *)
                            &expectedValues_1.
                             super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                           ((Span<const_unsigned_char,_18446744073709551615UL> *)
                            &expectedValues_1.
                             super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_140 = MILBlob::Util::
                    MakeSpan<MILBlob::Fp16,_std::vector,_std::allocator<MILBlob::Fp16>_>
                              ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100);
        SVar11.m_size = local_140.m_size.m_size;
        SVar11.m_ptr = (pointer)SVar11.m_size.m_size;
        local_130 = MILBlob::Util::SpanCast<unsigned_char_const,MILBlob::Fp16>
                              ((Util *)local_140.m_ptr,SVar11);
        __first2 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                             (&local_130);
        SVar11 = MILBlob::Util::MakeSpan<MILBlob::Fp16,_std::vector,_std::allocator<MILBlob::Fp16>_>
                           ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100);
        span.m_size = SVar11.m_size.m_size;
        span.m_ptr = (pointer)span.m_size.m_size;
        local_150 = MILBlob::Util::SpanCast<unsigned_char_const,MILBlob::Fp16>
                              ((Util *)SVar11.m_ptr,span);
        __last2 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end(&local_150);
        bVar1 = std::equal<unsigned_char_const*,unsigned_char_const*>
                          (ptVar5,ptVar6,__first2,__last2);
        bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x113);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,
                                   "std::equal(data.begin(), data.end(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).end())"
                                  );
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
        }
        expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
        std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::~vector
                  ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100);
        if (expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_40,0x140);
          expectedValues_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)SVar9.m_ptr;
          sVar3 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                            ((Span<const_unsigned_char,_18446744073709551615UL> *)
                             &expectedValues_2.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar3 == 0x10) {
            local_1a8[0] = 0x700000;
            local_1a8[1] = 0xc0fee;
            local_1a8[2] = 0x8face;
            local_1a8[3] = 0x91fade;
            local_198 = local_1a8;
            local_190 = 4;
            std::allocator<unsigned_int>::allocator(&local_1a9);
            __l._M_len = local_190;
            __l._M_array = local_198;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,__l,
                       &local_1a9);
            std::allocator<unsigned_int>::~allocator(&local_1a9);
            ptVar5 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                               ((Span<const_unsigned_char,_18446744073709551615UL> *)
                                &expectedValues_2.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                               ((Span<const_unsigned_char,_18446744073709551615UL> *)
                                &expectedValues_2.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_1d0 = MILBlob::Util::
                        MakeSpan<unsigned_int,_std::vector,_std::allocator<unsigned_int>_>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188)
            ;
            SVar12.m_size = local_1d0.m_size.m_size;
            SVar12.m_ptr = (pointer)SVar12.m_size.m_size;
            local_1c0 = MILBlob::Util::SpanCast<unsigned_char,unsigned_int>
                                  ((Util *)local_1d0.m_ptr,SVar12);
            ptVar7 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin(&local_1c0);
            SVar12 = MILBlob::Util::
                     MakeSpan<unsigned_int,_std::vector,_std::allocator<unsigned_int>_>
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
            span_00.m_size = SVar12.m_size.m_size;
            span_00.m_ptr = (pointer)span_00.m_size.m_size;
            local_1e0 = MILBlob::Util::SpanCast<unsigned_char,unsigned_int>
                                  ((Util *)SVar12.m_ptr,span_00);
            ptVar8 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end(&local_1e0);
            bVar1 = std::equal<unsigned_char_const*,unsigned_char*>(ptVar5,ptVar6,ptVar7,ptVar8);
            bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11b);
              poVar4 = std::operator<<(poVar4,": error: ");
              poVar4 = std::operator<<(poVar4,
                                       "std::equal(data.begin(), data.end(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).end())"
                                      );
              poVar4 = std::operator<<(poVar4," was false, expected true.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              tempfile._36_4_ = 1;
            }
            expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
            if (expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              tempfile._36_4_ = 0;
              expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x118);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,"(data.Size()) == (size_t(16))");
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            tempfile._36_4_ = 1;
            expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x110);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(data.Size()) == (size_t(8))");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
        expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x108);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(data.Size()) == (size_t(5))");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    tempfile._36_4_ = 1;
    expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  MILBlob::Blob::StorageReader::~StorageReader(&local_40);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&reader);
  return tempfile._36_4_;
}

Assistant:

int testStorageReaderTestsRawData()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read uint8_t weights from metadata 1
        const auto data = reader.GetRawDataView(64);
        ML_ASSERT_EQ(data.Size(), size_t(5));

        std::vector<uint8_t> expectedValues = {0x02, 0x00, 0x40, 0x00, 0x07};
        ML_ASSERT_SPAN_EQ(data, Util::MakeSpan(expectedValues));
    }

    {  // read Fp16 weights from metadata 2
        auto data = reader.GetRawDataView(192);
        ML_ASSERT_EQ(data.Size(), size_t(8));

        std::vector<Fp16> expectedValues = {Fp16(0x000E), Fp16(0xC0FE), Fp16(0x0810), Fp16(0x0000)};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)));
    }

    {  // read float weights from metadata 3
        auto data = reader.GetRawDataView(320);
        ML_ASSERT_EQ(data.Size(), size_t(16));

        std::vector<uint32_t> expectedValues = {0x700000, 0xC0FEE, 0x8FACE, 0x91FADE};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)));
    }

    return 0;
}